

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

void MultARGBRow_SSE2(uint32_t *ptr,int width,int inverse)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 auVar4 [16];
  __m128i A10;
  __m128i A7;
  __m128i A6;
  __m128i A5;
  __m128i A4;
  __m128i A3;
  __m128i A2;
  __m128i A1;
  __m128i A0;
  __m128i kMask;
  __m128i kMult;
  __m128i k128;
  __m128i zero;
  int kSpan;
  int x;
  char in_stack_fffffffffffffd98;
  char in_stack_fffffffffffffd99;
  char in_stack_fffffffffffffd9a;
  char in_stack_fffffffffffffd9b;
  char in_stack_fffffffffffffd9c;
  char in_stack_fffffffffffffd9d;
  char in_stack_fffffffffffffd9e;
  char in_stack_fffffffffffffd9f;
  undefined1 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda1;
  undefined1 in_stack_fffffffffffffda2;
  undefined1 in_stack_fffffffffffffda3;
  undefined1 in_stack_fffffffffffffda4;
  undefined1 in_stack_fffffffffffffda5;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  undefined4 local_18c;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 local_28;
  undefined2 uStack_26;
  undefined2 uStack_24;
  undefined2 uStack_22;
  undefined2 uStack_20;
  undefined2 uStack_1e;
  undefined2 uStack_1c;
  undefined2 uStack_1a;
  
  local_18c = 0;
  if (in_EDX == 0) {
    for (local_18c = 0; local_18c + 2 <= in_ESI; local_18c = local_18c + 2) {
      uVar1 = *(undefined8 *)(in_RDI + (long)local_18c * 4);
      local_c8 = (byte)uVar1;
      uStack_c7 = (byte)((ulong)uVar1 >> 8);
      uStack_c6 = (byte)((ulong)uVar1 >> 0x10);
      uStack_c5 = (byte)((ulong)uVar1 >> 0x18);
      uStack_c4 = (byte)((ulong)uVar1 >> 0x20);
      uStack_c3 = (byte)((ulong)uVar1 >> 0x28);
      uStack_c2 = (byte)((ulong)uVar1 >> 0x30);
      uStack_c1 = (byte)((ulong)uVar1 >> 0x38);
      auVar4._8_8_ = (ulong)CONCAT16(uStack_c1,
                                     (uint6)CONCAT14(uStack_c2,
                                                     (uint)CONCAT12(uStack_c3,(ushort)uStack_c4))) |
                     0xff00000000;
      auVar4._0_8_ = (ulong)CONCAT16(uStack_c5,
                                     (uint6)CONCAT14(uStack_c6,
                                                     (uint)CONCAT12(uStack_c7,(ushort)local_c8))) |
                     0xff00000000;
      auVar4 = pshuflw(auVar4,auVar4,0xbf);
      auVar4 = pshufhw(auVar4,auVar4,0xbf);
      local_88 = auVar4._0_2_;
      uStack_86 = auVar4._2_2_;
      uStack_84 = auVar4._4_2_;
      uStack_82 = auVar4._6_2_;
      uStack_80 = auVar4._8_2_;
      uStack_7e = auVar4._10_2_;
      uStack_7c = auVar4._12_2_;
      uStack_7a = auVar4._14_2_;
      uStack_96 = (ushort)uStack_c7;
      uStack_94 = (ushort)uStack_c6;
      uStack_92 = (ushort)uStack_c5;
      uStack_8e = (ushort)uStack_c3;
      uStack_8c = (ushort)uStack_c2;
      uStack_8a = (ushort)uStack_c1;
      auVar3._2_2_ = uStack_86 * uStack_96 + 0x80;
      auVar3._0_2_ = local_88 * (ushort)local_c8 + 0x80;
      auVar3._4_2_ = uStack_84 * uStack_94 + 0x80;
      auVar3._6_2_ = uStack_82 * uStack_92 + 0x80;
      auVar3._10_2_ = uStack_7e * uStack_8e + 0x80;
      auVar3._8_2_ = uStack_80 * (ushort)uStack_c4 + 0x80;
      auVar3._12_2_ = uStack_7c * uStack_8c + 0x80;
      auVar3._14_2_ = uStack_7a * uStack_8a + 0x80;
      auVar2._8_8_ = 0x101010101010101;
      auVar2._0_8_ = 0x101010101010101;
      auVar4 = pmulhuw(auVar3,auVar2);
      local_28 = auVar4._0_2_;
      uStack_26 = auVar4._2_2_;
      uStack_24 = auVar4._4_2_;
      uStack_22 = auVar4._6_2_;
      uStack_20 = auVar4._8_2_;
      uStack_1e = auVar4._10_2_;
      uStack_1c = auVar4._12_2_;
      uStack_1a = auVar4._14_2_;
      in_stack_fffffffffffffd98 =
           (0 < local_28) * (local_28 < 0x100) * auVar4[0] - (0xff < local_28);
      in_stack_fffffffffffffd99 =
           (0 < uStack_26) * (uStack_26 < 0x100) * auVar4[2] - (0xff < uStack_26);
      in_stack_fffffffffffffd9a =
           (0 < uStack_24) * (uStack_24 < 0x100) * auVar4[4] - (0xff < uStack_24);
      in_stack_fffffffffffffd9b =
           (0 < uStack_22) * (uStack_22 < 0x100) * auVar4[6] - (0xff < uStack_22);
      in_stack_fffffffffffffd9c =
           (0 < uStack_20) * (uStack_20 < 0x100) * auVar4[8] - (0xff < uStack_20);
      in_stack_fffffffffffffd9d =
           (0 < uStack_1e) * (uStack_1e < 0x100) * auVar4[10] - (0xff < uStack_1e);
      in_stack_fffffffffffffd9e =
           (0 < uStack_1c) * (uStack_1c < 0x100) * auVar4[0xc] - (0xff < uStack_1c);
      in_stack_fffffffffffffd9f =
           (0 < uStack_1a) * (uStack_1a < 0x100) * auVar4[0xe] - (0xff < uStack_1a);
      in_stack_fffffffffffffda0 = 0;
      in_stack_fffffffffffffda1 = 0;
      in_stack_fffffffffffffda2 = 0;
      in_stack_fffffffffffffda3 = 0;
      in_stack_fffffffffffffda4 = 0;
      in_stack_fffffffffffffda5 = 0;
      in_stack_fffffffffffffda6 = 0;
      in_stack_fffffffffffffda7 = 0;
      *(ulong *)(in_RDI + (long)local_18c * 4) =
           CONCAT17(in_stack_fffffffffffffd9f,
                    CONCAT16(in_stack_fffffffffffffd9e,
                             CONCAT15(in_stack_fffffffffffffd9d,
                                      CONCAT14(in_stack_fffffffffffffd9c,
                                               CONCAT13(in_stack_fffffffffffffd9b,
                                                        CONCAT12(in_stack_fffffffffffffd9a,
                                                                 CONCAT11(in_stack_fffffffffffffd99,
                                                                          in_stack_fffffffffffffd98)
                                                                ))))));
    }
  }
  if (0 < in_ESI - local_18c) {
    WebPMultARGBRow_C((uint32_t *)
                      CONCAT17(in_stack_fffffffffffffda7,
                               CONCAT16(in_stack_fffffffffffffda6,
                                        CONCAT15(in_stack_fffffffffffffda5,
                                                 CONCAT14(in_stack_fffffffffffffda4,
                                                          CONCAT13(in_stack_fffffffffffffda3,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffda2,
                                                  CONCAT11(in_stack_fffffffffffffda1,
                                                           in_stack_fffffffffffffda0))))))),
                      CONCAT13(in_stack_fffffffffffffd9f,
                               CONCAT12(in_stack_fffffffffffffd9e,
                                        CONCAT11(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd9c
                                                ))),
                      CONCAT13(in_stack_fffffffffffffd9b,
                               CONCAT12(in_stack_fffffffffffffd9a,
                                        CONCAT11(in_stack_fffffffffffffd99,in_stack_fffffffffffffd98
                                                ))));
  }
  return;
}

Assistant:

static void MultARGBRow_SSE2(uint32_t* const ptr, int width, int inverse) {
  int x = 0;
  if (!inverse) {
    const int kSpan = 2;
    const __m128i zero = _mm_setzero_si128();
    const __m128i k128 = _mm_set1_epi16(128);
    const __m128i kMult = _mm_set1_epi16(0x0101);
    const __m128i kMask = _mm_set_epi16(0, 0xff, 0, 0, 0, 0xff, 0, 0);
    for (x = 0; x + kSpan <= width; x += kSpan) {
      // To compute 'result = (int)(a * x / 255. + .5)', we use:
      //   tmp = a * v + 128, result = (tmp * 0x0101u) >> 16
      const __m128i A0 = _mm_loadl_epi64((const __m128i*)&ptr[x]);
      const __m128i A1 = _mm_unpacklo_epi8(A0, zero);
      const __m128i A2 = _mm_or_si128(A1, kMask);
      const __m128i A3 = _mm_shufflelo_epi16(A2, _MM_SHUFFLE(2, 3, 3, 3));
      const __m128i A4 = _mm_shufflehi_epi16(A3, _MM_SHUFFLE(2, 3, 3, 3));
      // here, A4 = [ff a0 a0 a0][ff a1 a1 a1]
      const __m128i A5 = _mm_mullo_epi16(A4, A1);
      const __m128i A6 = _mm_add_epi16(A5, k128);
      const __m128i A7 = _mm_mulhi_epu16(A6, kMult);
      const __m128i A10 = _mm_packus_epi16(A7, zero);
      _mm_storel_epi64((__m128i*)&ptr[x], A10);
    }
  }
  width -= x;
  if (width > 0) WebPMultARGBRow_C(ptr + x, width, inverse);
}